

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsTime helicsFederateRequestNextStep(HelicsFederate fed,HelicsError *err)

{
  bool bVar1;
  Time timeret;
  Federate *fedObj;
  Federate *in_stack_ffffffffffffffa8;
  double local_50;
  HelicsError *in_stack_ffffffffffffffb8;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffc0;
  TimeRepresentation<count_time<9,_long>_> local_28;
  Federate *local_20;
  double local_8;
  
  local_20 = getFed((HelicsFederate)in_stack_ffffffffffffffc0.internalTimeCode,
                    in_stack_ffffffffffffffb8);
  if (local_20 == (Federate *)0x0) {
    local_8 = -1.785e+39;
  }
  else {
    local_28.internalTimeCode =
         (baseType)helics::Federate::requestNextStep(in_stack_ffffffffffffffa8);
    TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_28,
                       (TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffc0);
    if (bVar1) {
      local_50 = TimeRepresentation::operator_cast_to_double
                           ((TimeRepresentation<count_time<9,_long>_> *)0x1bc4e1);
    }
    else {
      local_50 = 9223372036.854774;
    }
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

HelicsTime helicsFederateRequestNextStep(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeret = fedObj->requestNextStep();
        return (timeret < helics::Time::maxVal()) ? static_cast<double>(timeret) : HELICS_TIME_MAXTIME;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
}